

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O0

JL_STATUS OutputDictionaryKey(char *KeyName,JlBuffer *JsonBuffer,JL_OUTPUT_FLAGS OutputFlags)

{
  JL_STATUS JVar1;
  int iVar2;
  size_t DataSize;
  bool bVar3;
  char *local_30;
  char *quoteCharStr;
  _Bool noQuotes;
  JL_STATUS jlStatus;
  JL_OUTPUT_FLAGS OutputFlags_local;
  JlBuffer *JsonBuffer_local;
  char *KeyName_local;
  
  bVar3 = false;
  local_30 = "\"";
  if ((OutputFlags & 4) != 0) {
    JVar1 = CanKeyNameBeBare(KeyName);
    bVar3 = JVar1 != JL_STATUS_SUCCESS;
  }
  if ((!bVar3) && ((OutputFlags & 8) != 0)) {
    local_30 = "\'";
  }
  if (!bVar3) {
    JlBufferAdd(JsonBuffer,local_30,1);
  }
  DataSize = strlen(KeyName);
  JlBufferAdd(JsonBuffer,KeyName,DataSize);
  if (!bVar3) {
    JlBufferAdd(JsonBuffer,local_30,1);
  }
  iVar2 = 1;
  if ((OutputFlags & 2) != 0) {
    iVar2 = 2;
  }
  JVar1 = JlBufferAdd(JsonBuffer,": ",(long)iVar2);
  return JVar1;
}

Assistant:

JL_STATUS
    OutputDictionaryKey
    (
        char const*             KeyName,
        JlBuffer*               JsonBuffer,
        JL_OUTPUT_FLAGS         OutputFlags
    )
{
    JL_STATUS jlStatus;
    bool noQuotes = false;
    char* quoteCharStr = "\"";

    if( OutputFlags & JL_OUTPUT_FLAGS_J5_USE_BARE_KEYWORDS )
    {
        // See if this qualifies as bare keyword
        if( CanKeyNameBeBare( KeyName ) )
        {
            noQuotes = true;
        }
    }
    if( !noQuotes && OutputFlags & JL_OUTPUT_FLAGS_J5_SINGLE_QUOTES )
    {
        quoteCharStr = "\'";
    }

    if( !noQuotes )
    {
        jlStatus = JlBufferAdd( JsonBuffer, quoteCharStr, 1 );
    }

    jlStatus = JlBufferAdd( JsonBuffer, KeyName, strlen(KeyName) );

    if( !noQuotes )
    {
        jlStatus = JlBufferAdd( JsonBuffer, quoteCharStr, 1 );
    }
    jlStatus = JlBufferAdd( JsonBuffer, ": ", OutputFlags & JL_OUTPUT_FLAGS_INDENT ? 2 : 1 );

    return jlStatus;
}